

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O2

int __thiscall
TPZParFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::ClassId
          (TPZParFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZParFrontMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::ClassId
                    (&this->
                      super_TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZParFrontMatrix<TVar,store,front>::ClassId() const{
    return Hash("TPZParFrontMatrix") ^ TPZFrontMatrix<TVar, store, front>::ClassId() << 1;
}